

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::detail::do_report_error(format_func func,int error_code,char *message)

{
  memory_buffer full_message;
  buffer<char> local_228;
  char local_208 [512];
  
  local_228.ptr_ = local_208;
  local_228.size_ = 0;
  local_228.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_228.capacity_ = 500;
  (*func)(&local_228,error_code,message);
  do_report_error();
  return;
}

Assistant:

FMT_FUNC void do_report_error(format_func func, int error_code,
                              const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_all because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}